

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

void __thiscall
cmdline::parser::option_with_value<bool>::option_with_value
          (option_with_value<bool> *this,string *name,char short_name,bool need,bool *def,
          string *desc)

{
  string local_60;
  string *local_30;
  string *desc_local;
  bool *def_local;
  bool need_local;
  string *psStack_18;
  char short_name_local;
  string *name_local;
  option_with_value<bool> *this_local;
  
  local_30 = desc;
  desc_local = (string *)def;
  def_local._6_1_ = need;
  def_local._7_1_ = short_name;
  psStack_18 = name;
  name_local = (string *)this;
  option_base::option_base(&this->super_option_base);
  (this->super_option_base)._vptr_option_base = (_func_int **)&PTR__option_with_value_001ed620;
  std::__cxx11::string::string((string *)&this->nam,(string *)psStack_18);
  this->snam = def_local._7_1_;
  this->need = (bool)(def_local._6_1_ & 1);
  std::__cxx11::string::string((string *)&this->desc);
  this->has = false;
  this->def = (bool)((byte)desc_local->_M_dataplus & 1);
  this->actual = (bool)((byte)desc_local->_M_dataplus & 1);
  full_description(&local_60,this,local_30);
  std::__cxx11::string::operator=((string *)&this->desc,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

option_with_value(const std::string &name, char short_name, bool need, const T &def, const std::string &desc)
				: nam(name), snam(short_name), need(need), has(false), def(def), actual(def)
			{
				this->desc = full_description(desc);
			}